

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void __thiscall FNotifyBuffer::AddString(FNotifyBuffer *this,int printlevel,FString *source)

{
  int *piVar1;
  FString *this_00;
  char cVar2;
  BYTE *string;
  FNotifyText *pFVar3;
  uint uVar4;
  anon_enum_32 aVar5;
  int iVar6;
  FString *other;
  FString str;
  FNotifyText local_50;
  FBrokenLines *local_40;
  FString *local_38;
  
  if ((printlevel != 0x80) && (!show_messages.Value)) {
    return;
  }
  string = (BYTE *)source->Chars;
  if (*(int *)(string + -0xc) == 0) {
    return;
  }
  if ((uint)(gamestate + GS_FORCEWIPEBURN) < 2) {
    return;
  }
  if (con_notifylines.Value == 0) {
    return;
  }
  if (ConsoleDrawing == '\x01') {
    EnqueueConsoleText(true,printlevel,(char *)string);
    return;
  }
  if ((con_scaletext.Value != 1) || (iVar6 = CleanXfac, uiscale.Value != 0)) {
    if (con_scaletext.Value == 3) {
      iVar6 = 4;
    }
    else if (con_scaletext.Value == 2) {
      iVar6 = 2;
    }
    else {
      iVar6 = 1;
      if (con_scaletext.Value == 1) {
        iVar6 = uiscale.Value;
      }
    }
  }
  iVar6 = DisplayWidth / iVar6;
  if ((this->AddType == APPENDLINE) && (uVar4 = (this->Text).Count, uVar4 != 0)) {
    uVar4 = uVar4 - 1;
    pFVar3 = (this->Text).Array;
    if (pFVar3[uVar4].PrintLevel == printlevel) {
      FString::operator+((FString *)&local_50,&pFVar3[uVar4].Text);
      local_40 = V_BreakLines(SmallFont,iVar6,(BYTE *)CONCAT44(local_50.PrintLevel,local_50.TimeOut)
                              ,false);
      FString::~FString((FString *)&local_50);
      goto LAB_00351547;
    }
  }
  local_40 = V_BreakLines(SmallFont,iVar6,string,false);
  if (this->AddType == APPENDLINE) {
    this->AddType = NEWLINE;
  }
LAB_00351547:
  if (local_40 != (FBrokenLines *)0x0) {
    local_38 = source;
    if (-1 < local_40->Width) {
      this_00 = &local_50.Text;
      other = &local_40->Text;
      do {
        local_50.Text.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        FString::operator=(this_00,other);
        local_50.TimeOut = (int)(con_notifytime.Value * 35.0) + gametic;
        local_50.PrintLevel = printlevel;
        if ((this->AddType == NEWLINE) || (uVar4 = (this->Text).Count, uVar4 == 0)) {
          if ((0 < con_notifylines.Value) &&
             (uVar4 = (this->Text).Count, iVar6 = uVar4 - (con_notifylines.Value - 1U),
             con_notifylines.Value - 1U <= uVar4 && iVar6 != 0)) {
            TArray<FNotifyText,_FNotifyText>::Delete(&this->Text,0,iVar6);
          }
          TArray<FNotifyText,_FNotifyText>::Push(&this->Text,&local_50);
        }
        else {
          pFVar3 = (this->Text).Array + (uVar4 - 1);
          pFVar3->TimeOut = local_50.TimeOut;
          pFVar3->PrintLevel = printlevel;
          FString::operator=(&pFVar3->Text,this_00);
        }
        this->AddType = NEWLINE;
        FString::~FString(this_00);
        piVar1 = (int *)(other + 1);
        other = other + 2;
      } while (-1 < *piVar1);
    }
    V_FreeBrokenLines(local_40);
    cVar2 = local_38->Chars[(ulong)*(uint *)(local_38->Chars + -0xc) - 1];
    aVar5 = REPLACELINE;
    if (cVar2 != '\r') {
      aVar5 = (anon_enum_32)(cVar2 != '\n');
    }
    this->AddType = aVar5;
    this->TopGoal = 0;
  }
  return;
}

Assistant:

void FNotifyBuffer::AddString(int printlevel, FString source)
{
	FBrokenLines *lines;
	int i, width;

	if ((printlevel != 128 && !show_messages) ||
		source.IsEmpty() ||
		gamestate == GS_FULLCONSOLE ||
		gamestate == GS_DEMOSCREEN ||
		con_notifylines == 0)
		return;

	if (ConsoleDrawing)
	{
		EnqueueConsoleText (true, printlevel, source);
		return;
	}

	if (active_con_scaletext() == 0)
	{
		width = DisplayWidth / CleanXfac;
	}
	else
	{
		width = DisplayWidth / active_con_scaletext();
	}

	if (AddType == APPENDLINE && Text.Size() > 0 && Text[Text.Size() - 1].PrintLevel == printlevel)
	{
		FString str = Text[Text.Size() - 1].Text + source;
		lines = V_BreakLines (SmallFont, width, str);
	}
	else
	{
		lines = V_BreakLines (SmallFont, width, source);
		if (AddType == APPENDLINE)
		{
			AddType = NEWLINE;
		}
	}

	if (lines == NULL)
		return;

	for (i = 0; lines[i].Width >= 0; i++)
	{
		FNotifyText newline;

		newline.Text = lines[i].Text;
		newline.TimeOut = gametic + int(con_notifytime * TICRATE);
		newline.PrintLevel = printlevel;
		if (AddType == NEWLINE || Text.Size() == 0)
		{
			if (con_notifylines > 0)
			{
				Shift(con_notifylines - 1);
			}
			Text.Push(newline);
		}
		else
		{
			Text[Text.Size() - 1] = newline;
		}
		AddType = NEWLINE;
	}

	V_FreeBrokenLines (lines);
	lines = NULL;

	switch (source[source.Len()-1])
	{
	case '\r':	AddType = REPLACELINE;	break;
	case '\n':	AddType = NEWLINE;		break;
	default:	AddType = APPENDLINE;	break;
	}

	TopGoal = 0;
}